

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

void __thiscall diy::mpi::io::file::file(file *this,communicator *comm__,string *filename,int mode)

{
  MPI_Comm poVar1;
  int iVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  poVar1 = (comm__->comm_).data;
  (this->comm_).comm_.data = poVar1;
  iVar2 = comm__->size_;
  (this->comm_).rank_ = comm__->rank_;
  (this->comm_).size_ = iVar2;
  (this->comm_).owner_ = false;
  iVar2 = MPI_File_open(poVar1,(filename->_M_dataplus)._M_p,mode,&ompi_mpi_info_null,&this->fh);
  if (iVar2 == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"DIY cannot open file: ",filename);
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

diy::mpi::io::file::
file(const communicator& comm__, const std::string& filename, int mode)
: comm_(comm__)
{
#if DIY_HAS_MPI
  int ret = MPI_File_open(diy::mpi::mpi_cast(comm__.handle()), const_cast<char*>(filename.c_str()), mode, MPI_INFO_NULL, &diy::mpi::mpi_cast(fh));
  if (ret)
      throw std::runtime_error("DIY cannot open file: " + filename);
#else
  (void)comm__; (void)filename; (void)mode;
  DIY_UNSUPPORTED_MPI_CALL(MPI_File_open);
#endif
}